

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantiletobin.cpp
# Opt level: O0

void quantiletobin::doit(bool header)

{
  int iVar1;
  char *pcVar2;
  uint local_101c;
  char local_1018 [4];
  int lineno;
  char line [4096];
  float local_10;
  undefined1 local_9;
  float quantile;
  bool header_local;
  
  local_9 = header;
  if (header) {
    fgets(local_1018,0x1000,_stdin);
  }
  local_101c = 2;
  while( true ) {
    pcVar2 = fgets(local_1018,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(local_1018,"%f",&local_10);
    if (iVar1 != 1) break;
    if ((1.0 < local_10) || (local_10 < 0.0)) {
      fprintf(_stderr,"FATAL: Invalid quantile %f on line %d",(double)local_10,(ulong)local_101c);
      fprintf(_stderr,": quantiles must lie between 0 and 1 - ignoring...\n");
    }
    else {
      fwrite(&local_10,4,1,_stdout);
      local_101c = local_101c + 1;
    }
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s\n",(ulong)local_101c,local_1018);
  exit(1);
}

Assistant:

void doit(bool header) {

    float quantile;
    char line[4096];
    int lineno = 1;
    if (header) {
      fgets(line, sizeof(line), stdin);   // Skip header line
    }
    lineno++;

    while (fgets(line, sizeof(line), stdin) != 0) {

      if (sscanf(line, "%f", &quantile) != 1) {

	fprintf(stderr, "FATAL: Invalid data in line %d:\n%s\n", lineno, line);
	exit(EXIT_FAILURE);

      } else {
	      
	if (quantile > 1.0 || quantile < 0.0) {
	fprintf(stderr, "FATAL: Invalid quantile %f on line %d", quantile, lineno);
	fprintf(stderr, ": quantiles must lie between 0 and 1 - ignoring...\n");
	continue;
	}

	fwrite(&quantile, sizeof(quantile), 1, stdout);

      }
      lineno++;

    }

  }